

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_ssl_client.cpp
# Opt level: O0

uchar __thiscall
bidfx_public_api::tools::OpenSSLClient::InputStreamImpl::ReadByte(InputStreamImpl *this)

{
  uchar uVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  uchar byte;
  error_code local_30;
  long local_20;
  size_t bytes_read;
  uchar *bytes;
  InputStreamImpl *this_local;
  
  bytes = (uchar *)this;
  bytes_read = (size_t)operator_new__(1);
  iVar2 = (*(this->super_InputStream)._vptr_InputStream[1])(this,bytes_read,1);
  local_20 = CONCAT44(extraout_var,iVar2);
  if (local_20 == -1) {
    pcVar3 = (char *)__cxa_allocate_exception(0x20);
    std::error_code::error_code<std::io_errc,void>(&local_30,stream);
    std::ios_base::failure[abi:cxx11]::failure(pcVar3,(error_code *)"Could not read byte");
    __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  uVar1 = *(uchar *)bytes_read;
  if (bytes_read != 0) {
    operator_delete__((void *)bytes_read);
  }
  return uVar1;
}

Assistant:

unsigned char OpenSSLClient::InputStreamImpl::ReadByte()
{
    auto* bytes = new unsigned char[1];
    size_t bytes_read = ReadBytes(bytes, 1);
    if (bytes_read == -1)
    {
        throw std::ios_base::failure("Could not read byte");
    }

    unsigned char byte = bytes[0];
    delete[](bytes);
    return byte;
}